

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BinaryFileFormat.cpp
# Opt level: O0

void __thiscall pbrt::BinaryReader::BinaryReader(BinaryReader *this,istream *str)

{
  char *pcVar1;
  byte bVar2;
  bool bVar3;
  runtime_error *this_00;
  ostream *poVar4;
  uchar *puVar5;
  element_type *peVar6;
  undefined8 in_RSI;
  long in_RDI;
  SP newEntity;
  int32_t tag;
  uint64_t size;
  int fileMajor;
  int ourMajor;
  int32_t formatTag;
  int in_stack_00000224;
  BinaryReader *in_stack_00000228;
  ostream *in_stack_ffffffffffffff48;
  ostream *in_stack_ffffffffffffff50;
  ostream *in_stack_ffffffffffffff58;
  ostream *in_stack_ffffffffffffff60;
  __shared_ptr local_50 [20];
  undefined1 local_3c [4];
  undefined1 local_38 [12];
  int local_2c;
  undefined4 local_28;
  int local_14;
  undefined8 local_10;
  
  local_10 = in_RSI;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x22b7c1);
  std::vector<std::shared_ptr<pbrt::Entity>,_std::allocator<std::shared_ptr<pbrt::Entity>_>_>::
  vector((vector<std::shared_ptr<pbrt::Entity>,_std::allocator<std::shared_ptr<pbrt::Entity>_>_> *)
         0x22b7d4);
  *(undefined8 *)(in_RDI + 0x38) = local_10;
  bVar2 = std::ios::good();
  if ((bVar2 & 1) != 0) {
    std::istream::read(*(char **)(in_RDI + 0x38),(long)&local_14);
    if (local_14 != 9) {
      poVar4 = std::operator<<((ostream *)&std::cout,
                               "Warning: pbf file uses a different format tag (");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,(void *)(long)local_14);
      poVar4 = std::operator<<(poVar4,") than what this library is expecting (");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,(void *)0x9);
      in_stack_ffffffffffffff60 = std::operator<<(poVar4,")");
      std::ostream::operator<<(in_stack_ffffffffffffff60,std::endl<char,std::char_traits<char>>);
      local_28 = 0;
      local_2c = local_14 >> 0x10;
      if (local_2c != 0) {
        in_stack_ffffffffffffff58 =
             std::operator<<((ostream *)&std::cout,
                             "**** WARNING ***** : Even the *major* file format version is different - "
                            );
        in_stack_ffffffffffffff50 =
             std::operator<<(in_stack_ffffffffffffff58,
                             "this means the file _should_ be incompatible with this library. ");
        in_stack_ffffffffffffff48 =
             std::operator<<(in_stack_ffffffffffffff50,"Please regenerate the pbf file.");
        std::ostream::operator<<(in_stack_ffffffffffffff48,std::endl<char,std::char_traits<char>>);
      }
    }
    while( true ) {
      std::istream::read(*(char **)(in_RDI + 0x38),(long)local_38);
      bVar2 = std::ios::good();
      if ((bVar2 & 1) == 0) break;
      std::istream::read(*(char **)(in_RDI + 0x38),(long)local_3c);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffff60,
                 (size_type)in_stack_ffffffffffffff58);
      pcVar1 = *(char **)(in_RDI + 0x38);
      puVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                         ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x22ba59);
      std::istream::read(pcVar1,(long)puVar5);
      *(undefined8 *)(in_RDI + 0x18) = 0;
      createEntity(in_stack_00000228,in_stack_00000224);
      std::vector<std::shared_ptr<pbrt::Entity>,_std::allocator<std::shared_ptr<pbrt::Entity>_>_>::
      push_back((vector<std::shared_ptr<pbrt::Entity>,_std::allocator<std::shared_ptr<pbrt::Entity>_>_>
                 *)in_stack_ffffffffffffff50,(value_type *)in_stack_ffffffffffffff48);
      bVar3 = std::__shared_ptr::operator_cast_to_bool(local_50);
      if (bVar3) {
        peVar6 = std::__shared_ptr_access<pbrt::Entity,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<pbrt::Entity,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x22babe);
        (*peVar6->_vptr_Entity[2])(peVar6,in_RDI);
      }
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::clear
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x22bafd);
      std::shared_ptr<pbrt::Entity>::~shared_ptr((shared_ptr<pbrt::Entity> *)0x22bb07);
    }
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"invalid input stream - could not open file?");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

BinaryReader(std::istream &str)
      : binStream(str)
    {
      int32_t formatTag;
      if (!binStream.good())
        throw std::runtime_error("invalid input stream - could not open file?");
      binStream.read((char*)&formatTag,sizeof(formatTag));
      if (formatTag != ourFormatTag) {
        std::cout << "Warning: pbf file uses a different format tag ("
                  << ((int*)(size_t)formatTag) << ") than what this library is expecting ("
                  << ((int *)(size_t)ourFormatTag) << ")" << std::endl;
        int ourMajor = ourFormatTag >> 16;
        int fileMajor = formatTag >> 16;
        if (ourMajor != fileMajor)
          std::cout << "**** WARNING ***** : Even the *major* file format version is different - "
                    << "this means the file _should_ be incompatible with this library. "
                    << "Please regenerate the pbf file." << std::endl;
      }
      while (1) {
        uint64_t size;
        binStream.read((char*)&size,sizeof(size));
        if (!binStream.good())
          break;
        int32_t tag;
        binStream.read((char*)&tag,sizeof(tag));
        currentEntityData.resize(size);
        binStream.read((char *)currentEntityData.data(),size);
        currentEntityOffset = 0;

        Entity::SP newEntity = createEntity(tag);
        readEntities.push_back(newEntity);
        if (newEntity) newEntity->readFrom(*this);
        currentEntityData.clear();
      }
      // exit(0);
    }